

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock_test.cc
# Opt level: O0

void subblock_test(void)

{
  int iVar1;
  size_t sVar2;
  filemgr_open_result fVar3;
  btree_meta meta;
  filemgr_config fconfig;
  btree btree_arr [64];
  btree btree;
  btree_kv_ops *ops;
  btreeblk_handle bhandle;
  filemgr *file;
  size_t idx;
  size_t subblock_no;
  bid_t bid;
  btree_result br;
  filemgr_open_result result;
  char temp [256];
  char valuebuf [256];
  char keybuf [256];
  char *fname;
  int blocksize;
  int nodesize;
  int nbtrees;
  int r;
  int k;
  int j;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined4 in_stack_ffffffffffffebc0;
  undefined4 uVar4;
  uint32_t in_stack_ffffffffffffebc4;
  filemgr *in_stack_ffffffffffffebc8;
  filemgr *pfVar5;
  undefined4 in_stack_ffffffffffffebd0;
  uint in_stack_ffffffffffffebd4;
  uint uVar6;
  btree_blk_ops *in_stack_ffffffffffffebd8;
  btree_blk_ops *blk_ops;
  void *in_stack_ffffffffffffebe0;
  char *blk_handle;
  undefined4 in_stack_ffffffffffffebe8;
  uint in_stack_ffffffffffffebec;
  btree_meta *in_stack_ffffffffffffec00;
  undefined1 *in_stack_ffffffffffffec08;
  btree_meta *in_stack_ffffffffffffec10;
  undefined4 uStack_133c;
  undefined4 uStack_132c;
  undefined4 uStack_131c;
  undefined4 uStack_130c;
  undefined4 uStack_12fc;
  undefined4 uStack_12ec;
  undefined4 uStack_12dc;
  undefined2 local_12d8;
  void *local_12d0;
  uint32_t local_12c8 [4];
  undefined1 local_12b8;
  undefined2 local_12a8;
  btree_blk_ops local_1268 [6];
  err_log_callback *in_stack_ffffffffffffef78;
  filemgr_config *in_stack_ffffffffffffef80;
  filemgr_ops *in_stack_ffffffffffffef88;
  char *in_stack_ffffffffffffef90;
  err_log_callback *in_stack_fffffffffffff200;
  char *in_stack_fffffffffffff208;
  undefined1 in_stack_fffffffffffff217;
  filemgr *in_stack_fffffffffffff218;
  btree local_468;
  btree_kv_ops *local_430;
  filemgr *local_3b0;
  size_t local_3a8;
  size_t local_3a0;
  bid_t local_398;
  btree_result local_38c;
  filemgr *local_388;
  undefined8 local_380;
  undefined1 local_378 [256];
  btree_meta local_278 [16];
  char local_178 [256];
  char *local_78;
  uint32_t local_6c;
  int local_68;
  int local_64;
  int local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  local_6c = 0x1000;
  local_78 = "./btreeblock_testfile";
  memset(local_12c8,0,0x60);
  local_12c8[0] = local_6c;
  local_12c8[1] = 0;
  local_12b8 = 8;
  local_12a8 = 8;
  local_430 = btree_kv_get_kb64_vb64
                        ((btree_kv_ops *)
                         CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0));
  local_60 = system("rm -rf  btreeblock_testfile");
  get_filemgr_ops();
  fVar3 = filemgr_open(in_stack_ffffffffffffef90,in_stack_ffffffffffffef88,in_stack_ffffffffffffef80
                       ,in_stack_ffffffffffffef78);
  local_3b0 = fVar3.file;
  local_380 = CONCAT44(uStack_12dc,fVar3.rv);
  local_388 = local_3b0;
  local_12d0 = malloc(0x1000);
  local_12d8 = 0x78;
  btreeblk_init((btreeblk_handle *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),
                in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc4);
  btreeblk_get_ops();
  pfVar5 = (filemgr *)&local_12d8;
  btree_init((btree *)CONCAT44(in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8),
             in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8,
             (btree_kv_ops *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),
             (uint32_t)((ulong)pfVar5 >> 0x20),(uint8_t)((ulong)pfVar5 >> 0x18),
             (uint8_t)in_stack_ffffffffffffec00,(bnode_flag_t)in_stack_ffffffffffffec08,
             in_stack_ffffffffffffec10);
  iVar1 = is_subblock(local_468.root_bid);
  if (iVar1 == 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
            ,0x16d);
    subblock_test::__test_pass = 0;
    iVar1 = is_subblock(local_468.root_bid);
    if (iVar1 == 0) {
      __assert_fail("is_subblock(btree.root_bid)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                    ,0x16d,"void subblock_test()");
    }
  }
  subbid2bid(local_468.root_bid,&local_3a0,&local_3a8,&local_398);
  if (local_3a0 != 1) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
            ,0x16f);
    subblock_test::__test_pass = 0;
    if (local_3a0 != 1) {
      __assert_fail("subblock_no == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                    ,0x16f,"void subblock_test()");
    }
  }
  btreeblk_free((btreeblk_handle *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0));
  local_12d8 = 0xfa;
  btreeblk_init((btreeblk_handle *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),
                pfVar5,in_stack_ffffffffffffebc4);
  btreeblk_get_ops();
  pfVar5 = (filemgr *)&local_12d8;
  btree_init((btree *)CONCAT44(in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8),
             in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8,
             (btree_kv_ops *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),
             (uint32_t)((ulong)pfVar5 >> 0x20),(uint8_t)((ulong)pfVar5 >> 0x18),
             (uint8_t)in_stack_ffffffffffffec00,(bnode_flag_t)in_stack_ffffffffffffec08,
             in_stack_ffffffffffffec10);
  iVar1 = is_subblock(local_468.root_bid);
  if (iVar1 == 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
            ,0x176);
    subblock_test::__test_pass = 0;
    iVar1 = is_subblock(local_468.root_bid);
    if (iVar1 == 0) {
      __assert_fail("is_subblock(btree.root_bid)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                    ,0x176,"void subblock_test()");
    }
  }
  subbid2bid(local_468.root_bid,&local_3a0,&local_3a8,&local_398);
  if (local_3a0 != 2) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
            ,0x178);
    subblock_test::__test_pass = 0;
    if (local_3a0 != 2) {
      __assert_fail("subblock_no == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                    ,0x178,"void subblock_test()");
    }
  }
  btreeblk_free((btreeblk_handle *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0));
  local_12d8 = 0x1fe;
  btreeblk_init((btreeblk_handle *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),
                pfVar5,in_stack_ffffffffffffebc4);
  btreeblk_get_ops();
  pfVar5 = (filemgr *)&local_12d8;
  btree_init((btree *)CONCAT44(in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8),
             in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8,
             (btree_kv_ops *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),
             (uint32_t)((ulong)pfVar5 >> 0x20),(uint8_t)((ulong)pfVar5 >> 0x18),
             (uint8_t)in_stack_ffffffffffffec00,(bnode_flag_t)in_stack_ffffffffffffec08,
             in_stack_ffffffffffffec10);
  iVar1 = is_subblock(local_468.root_bid);
  if (iVar1 == 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
            ,0x17f);
    subblock_test::__test_pass = 0;
    iVar1 = is_subblock(local_468.root_bid);
    if (iVar1 == 0) {
      __assert_fail("is_subblock(btree.root_bid)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                    ,0x17f,"void subblock_test()");
    }
  }
  subbid2bid(local_468.root_bid,&local_3a0,&local_3a8,&local_398);
  if (local_3a0 != 3) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
            ,0x181);
    subblock_test::__test_pass = 0;
    if (local_3a0 != 3) {
      __assert_fail("subblock_no == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                    ,0x181,"void subblock_test()");
    }
  }
  btreeblk_free((btreeblk_handle *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0));
  local_12d8 = 0x3fc;
  btreeblk_init((btreeblk_handle *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),
                pfVar5,in_stack_ffffffffffffebc4);
  btreeblk_get_ops();
  pfVar5 = (filemgr *)&local_12d8;
  btree_init((btree *)CONCAT44(in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8),
             in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8,
             (btree_kv_ops *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),
             (uint32_t)((ulong)pfVar5 >> 0x20),(uint8_t)((ulong)pfVar5 >> 0x18),
             (uint8_t)in_stack_ffffffffffffec00,(bnode_flag_t)in_stack_ffffffffffffec08,
             in_stack_ffffffffffffec10);
  iVar1 = is_subblock(local_468.root_bid);
  if (iVar1 == 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
            ,0x188);
    subblock_test::__test_pass = 0;
    iVar1 = is_subblock(local_468.root_bid);
    if (iVar1 == 0) {
      __assert_fail("is_subblock(btree.root_bid)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                    ,0x188,"void subblock_test()");
    }
  }
  subbid2bid(local_468.root_bid,&local_3a0,&local_3a8,&local_398);
  if (local_3a0 != 4) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
            ,0x18a);
    subblock_test::__test_pass = 0;
    if (local_3a0 != 4) {
      __assert_fail("subblock_no == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                    ,0x18a,"void subblock_test()");
    }
  }
  btreeblk_free((btreeblk_handle *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0));
  local_12d8 = 0x7f8;
  btreeblk_init((btreeblk_handle *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),
                pfVar5,in_stack_ffffffffffffebc4);
  btreeblk_get_ops();
  pfVar5 = (filemgr *)&local_12d8;
  btree_init((btree *)CONCAT44(in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8),
             in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8,
             (btree_kv_ops *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),
             (uint32_t)((ulong)pfVar5 >> 0x20),(uint8_t)((ulong)pfVar5 >> 0x18),
             (uint8_t)in_stack_ffffffffffffec00,(bnode_flag_t)in_stack_ffffffffffffec08,
             in_stack_ffffffffffffec10);
  iVar1 = is_subblock(local_468.root_bid);
  if (iVar1 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
            ,0x191);
    subblock_test::__test_pass = 0;
    iVar1 = is_subblock(local_468.root_bid);
    if (iVar1 != 0) {
      __assert_fail("!is_subblock(btree.root_bid)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                    ,0x191,"void subblock_test()");
    }
  }
  btreeblk_free((btreeblk_handle *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0));
  local_12d8 = 0xffa;
  btreeblk_init((btreeblk_handle *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),
                pfVar5,in_stack_ffffffffffffebc4);
  btreeblk_get_ops();
  pfVar5 = (filemgr *)&local_12d8;
  local_38c = btree_init((btree *)CONCAT44(in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8),
                         in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8,
                         (btree_kv_ops *)
                         CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),
                         (uint32_t)((ulong)pfVar5 >> 0x20),(uint8_t)((ulong)pfVar5 >> 0x18),
                         (uint8_t)in_stack_ffffffffffffec00,(bnode_flag_t)in_stack_ffffffffffffec08,
                         in_stack_ffffffffffffec10);
  if (local_38c != BTREE_RESULT_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
            ,0x198);
    subblock_test::__test_pass = 0;
    if (local_38c != BTREE_RESULT_FAIL) {
      __assert_fail("br == BTREE_RESULT_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                    ,0x198,"void subblock_test()");
    }
  }
  btreeblk_free((btreeblk_handle *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0));
  filemgr_close(in_stack_fffffffffffff218,(bool)in_stack_fffffffffffff217,in_stack_fffffffffffff208,
                in_stack_fffffffffffff200);
  filemgr_shutdown();
  free(local_12d0);
  local_60 = system("rm -rf  btreeblock_testfile");
  get_filemgr_ops();
  fVar3 = filemgr_open(in_stack_ffffffffffffef90,in_stack_ffffffffffffef88,in_stack_ffffffffffffef80
                       ,in_stack_ffffffffffffef78);
  local_3b0 = fVar3.file;
  local_380 = CONCAT44(uStack_12ec,fVar3.rv);
  local_388 = local_3b0;
  btreeblk_init((btreeblk_handle *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),
                pfVar5,in_stack_ffffffffffffebc4);
  btreeblk_get_ops();
  pfVar5 = (filemgr *)0x0;
  btree_init((btree *)CONCAT44(in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8),
             in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8,
             (btree_kv_ops *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),0,'\0',
             (uint8_t)in_stack_ffffffffffffec00,(bnode_flag_t)in_stack_ffffffffffffec08,
             in_stack_ffffffffffffec10);
  local_54 = 0;
  do {
    if (0xff < (int)local_54) {
      btreeblk_free((btreeblk_handle *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0)
                   );
      filemgr_close(in_stack_fffffffffffff218,(bool)in_stack_fffffffffffff217,
                    in_stack_fffffffffffff208,in_stack_fffffffffffff200);
      filemgr_shutdown();
      local_60 = system("rm -rf  btreeblock_testfile");
      get_filemgr_ops();
      fVar3 = filemgr_open(in_stack_ffffffffffffef90,in_stack_ffffffffffffef88,
                           in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
      local_3b0 = fVar3.file;
      local_380 = CONCAT44(uStack_12fc,fVar3.rv);
      local_388 = local_3b0;
      btreeblk_init((btreeblk_handle *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0)
                    ,pfVar5,in_stack_ffffffffffffebc4);
      btreeblk_get_ops();
      uVar4 = 0;
      pfVar5 = (filemgr *)0x0;
      btree_init((btree *)CONCAT44(in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8),
                 in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8,
                 (btree_kv_ops *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),0,
                 '\0',(uint8_t)in_stack_ffffffffffffec00,(bnode_flag_t)in_stack_ffffffffffffec08,
                 in_stack_ffffffffffffec10);
      local_54 = 0;
      do {
        if (0xff < (int)local_54) {
          btreeblk_free((btreeblk_handle *)
                        CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0));
          filemgr_close(in_stack_fffffffffffff218,(bool)in_stack_fffffffffffff217,
                        in_stack_fffffffffffff208,in_stack_fffffffffffff200);
          filemgr_shutdown();
          local_64 = 2;
          local_60 = system("rm -rf  btreeblock_testfile");
          get_filemgr_ops();
          fVar3 = filemgr_open(in_stack_ffffffffffffef90,in_stack_ffffffffffffef88,
                               in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
          local_3b0 = fVar3.file;
          local_380 = CONCAT44(uStack_130c,fVar3.rv);
          local_388 = local_3b0;
          btreeblk_init((btreeblk_handle *)
                        CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),pfVar5,
                        in_stack_ffffffffffffebc4);
          for (local_54 = 0; (int)local_54 < local_64; local_54 = local_54 + 1) {
            btreeblk_get_ops();
            uVar4 = 0;
            pfVar5 = (filemgr *)0x0;
            btree_init((btree *)CONCAT44(in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8),
                       in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8,
                       (btree_kv_ops *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0)
                       ,0,'\0',(uint8_t)in_stack_ffffffffffffec00,
                       (bnode_flag_t)in_stack_ffffffffffffec08,in_stack_ffffffffffffec10);
          }
          local_54 = 0;
          do {
            if (0xff < (int)local_54) {
              btreeblk_free((btreeblk_handle *)
                            CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0));
              filemgr_close(in_stack_fffffffffffff218,(bool)in_stack_fffffffffffff217,
                            in_stack_fffffffffffff208,in_stack_fffffffffffff200);
              filemgr_shutdown();
              local_64 = 2;
              local_60 = system("rm -rf  btreeblock_testfile");
              get_filemgr_ops();
              fVar3 = filemgr_open(in_stack_ffffffffffffef90,in_stack_ffffffffffffef88,
                                   in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
              local_3b0 = fVar3.file;
              local_380 = CONCAT44(uStack_131c,fVar3.rv);
              local_388 = local_3b0;
              btreeblk_init((btreeblk_handle *)
                            CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),pfVar5,
                            in_stack_ffffffffffffebc4);
              for (local_54 = 0; (int)local_54 < local_64; local_54 = local_54 + 1) {
                btreeblk_get_ops();
                uVar4 = 0;
                pfVar5 = (filemgr *)0x0;
                btree_init((btree *)CONCAT44(in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8),
                           in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8,
                           (btree_kv_ops *)
                           CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),0,'\0',
                           (uint8_t)in_stack_ffffffffffffec00,
                           (bnode_flag_t)in_stack_ffffffffffffec08,in_stack_ffffffffffffec10);
              }
              local_54 = 0;
              do {
                if (0xff < (int)local_54) {
                  btreeblk_free((btreeblk_handle *)
                                CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0));
                  filemgr_close(in_stack_fffffffffffff218,(bool)in_stack_fffffffffffff217,
                                in_stack_fffffffffffff208,in_stack_fffffffffffff200);
                  filemgr_shutdown();
                  local_64 = 7;
                  local_60 = system("rm -rf  btreeblock_testfile");
                  get_filemgr_ops();
                  fVar3 = filemgr_open(in_stack_ffffffffffffef90,in_stack_ffffffffffffef88,
                                       in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
                  local_3b0 = fVar3.file;
                  local_380 = CONCAT44(uStack_132c,fVar3.rv);
                  local_388 = local_3b0;
                  btreeblk_init((btreeblk_handle *)
                                CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),pfVar5
                                ,in_stack_ffffffffffffebc4);
                  for (local_54 = 0; (int)local_54 < local_64; local_54 = local_54 + 1) {
                    btreeblk_get_ops();
                    uVar4 = 0;
                    pfVar5 = (filemgr *)0x0;
                    btree_init((btree *)CONCAT44(in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8
                                                ),in_stack_ffffffffffffebe0,
                               in_stack_ffffffffffffebd8,
                               (btree_kv_ops *)
                               CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),0,'\0',
                               (uint8_t)in_stack_ffffffffffffec00,
                               (bnode_flag_t)in_stack_ffffffffffffec08,in_stack_ffffffffffffec10);
                  }
                  for (local_58 = 0; (int)local_58 < local_64; local_58 = local_58 + 1) {
                    local_68 = (1 << ((byte)local_58 & 0x1f)) << 7;
                    for (local_54 = 0; (int)local_54 < (local_68 + -0x10) / 0x10;
                        local_54 = local_54 + 1) {
                      sprintf(local_178,"%02d%06d",(ulong)local_58,(ulong)local_54);
                      sprintf((char *)local_278,"%02d%06x",(ulong)local_58,(ulong)local_54);
                      btree_insert((btree *)(&local_1268[0].blk_alloc + (long)(int)local_58 * 7),
                                   local_178,local_278);
                      btreeblk_end((btreeblk_handle *)pfVar5);
                    }
                    in_stack_ffffffffffffebec = local_54;
                    filemgr_commit((filemgr *)
                                   CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),
                                   SUB81((ulong)pfVar5 >> 0x38,0),
                                   (err_log_callback *)CONCAT44(in_stack_ffffffffffffebc4,uVar4));
                  }
                  btreeblk_free((btreeblk_handle *)
                                CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0));
                  filemgr_close(in_stack_fffffffffffff218,(bool)in_stack_fffffffffffff217,
                                in_stack_fffffffffffff208,in_stack_fffffffffffff200);
                  filemgr_shutdown();
                  local_64 = 7;
                  local_60 = system("rm -rf  btreeblock_testfile");
                  blk_handle = local_78;
                  get_filemgr_ops();
                  fVar3 = filemgr_open(in_stack_ffffffffffffef90,in_stack_ffffffffffffef88,
                                       in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
                  local_3b0 = fVar3.file;
                  local_380 = CONCAT44(uStack_133c,fVar3.rv);
                  local_388 = local_3b0;
                  btreeblk_init((btreeblk_handle *)
                                CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),pfVar5
                                ,in_stack_ffffffffffffebc4);
                  for (local_54 = 0; (int)local_54 < local_64; local_54 = local_54 + 1) {
                    blk_ops = (btree_blk_ops *)(&local_1268[0].blk_alloc + (long)(int)local_54 * 7);
                    btreeblk_get_ops();
                    uVar4 = 0;
                    pfVar5 = (filemgr *)0x0;
                    btree_init((btree *)CONCAT44(in_stack_ffffffffffffebec,in_stack_ffffffffffffebe8
                                                ),blk_handle,blk_ops,
                               (btree_kv_ops *)
                               CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),0,'\0',
                               (uint8_t)in_stack_ffffffffffffec00,
                               (bnode_flag_t)in_stack_ffffffffffffec08,in_stack_ffffffffffffec10);
                  }
                  for (local_58 = 0; (int)local_58 < local_64; local_58 = local_58 + 1) {
                    local_68 = (1 << ((byte)local_58 & 0x1f)) << 7;
                    for (local_54 = 0; (int)local_54 < (local_68 + -0x10) / 0x10;
                        local_54 = local_54 + 1) {
                      uVar6 = local_54;
                      sprintf(local_178,"%02d%06d",(ulong)local_58,(ulong)local_54);
                      sprintf((char *)local_278,"%02d%06x",(ulong)local_58,(ulong)local_54);
                      btree_insert((btree *)(&local_1268[0].blk_alloc + (long)(int)local_58 * 7),
                                   local_178,local_278);
                      btreeblk_end((btreeblk_handle *)pfVar5);
                      filemgr_commit((filemgr *)CONCAT44(uVar6,in_stack_ffffffffffffebd0),
                                     SUB81((ulong)pfVar5 >> 0x38,0),
                                     (err_log_callback *)CONCAT44(in_stack_ffffffffffffebc4,uVar4));
                    }
                    in_stack_ffffffffffffebd4 = local_54;
                  }
                  btreeblk_free((btreeblk_handle *)
                                CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0));
                  filemgr_close(in_stack_fffffffffffff218,(bool)in_stack_fffffffffffff217,
                                in_stack_fffffffffffff208,in_stack_fffffffffffff200);
                  filemgr_shutdown();
                  free(local_430);
                  if (subblock_test::__test_pass == 0) {
                    fprintf(_stderr,"%s FAILED\n","subblock test");
                  }
                  else {
                    fprintf(_stderr,"%s PASSED\n","subblock test");
                  }
                  return;
                }
                for (local_58 = 0; (int)local_58 < local_64; local_58 = local_58 + 1) {
                  sprintf(local_178,"%02d%06d",(ulong)local_58,(ulong)local_54);
                  sprintf((char *)local_278,"%02d%06x",(ulong)local_58,(ulong)local_54);
                  btree_insert((btree *)(&local_1268[0].blk_alloc + (long)(int)local_58 * 7),
                               local_178,local_278);
                  btreeblk_end((btreeblk_handle *)pfVar5);
                }
                filemgr_commit((filemgr *)
                               CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),
                               SUB81((ulong)pfVar5 >> 0x38,0),
                               (err_log_callback *)CONCAT44(in_stack_ffffffffffffebc4,uVar4));
                for (local_58 = 0; (int)local_58 < local_64; local_58 = local_58 + 1) {
                  for (local_5c = 0; (int)local_5c <= (int)local_54; local_5c = local_5c + 1) {
                    sprintf(local_178,"%02d%06d",(ulong)local_58,(ulong)local_5c);
                    sprintf((char *)local_278,"%02d%06x",(ulong)local_58,(ulong)local_5c);
                    btree_find((btree *)(&local_1268[0].blk_alloc + (long)(int)local_58 * 7),
                               local_178,local_378);
                    btreeblk_end((btreeblk_handle *)pfVar5);
                    in_stack_ffffffffffffec10 = local_278;
                    sVar2 = strlen((char *)local_278);
                    iVar1 = memcmp(in_stack_ffffffffffffec10,local_378,sVar2);
                    if (iVar1 != 0) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                              ,0x209);
                      subblock_test::__test_pass = 0;
                      in_stack_ffffffffffffec00 = local_278;
                      in_stack_ffffffffffffec08 = local_378;
                      sVar2 = strlen((char *)local_278);
                      iVar1 = memcmp(in_stack_ffffffffffffec00,in_stack_ffffffffffffec08,sVar2);
                      if (iVar1 != 0) {
                        __assert_fail("!memcmp(valuebuf, temp, strlen(valuebuf))",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                      ,0x209,"void subblock_test()");
                      }
                    }
                  }
                }
                local_54 = local_54 + 1;
              } while( true );
            }
            for (local_58 = 0; (int)local_58 < local_64; local_58 = local_58 + 1) {
              sprintf(local_178,"%02d%06d",(ulong)local_58,(ulong)local_54);
              sprintf((char *)local_278,"%02d%06x",(ulong)local_58,(ulong)local_54);
              btree_insert((btree *)(&local_1268[0].blk_alloc + (long)(int)local_58 * 7),local_178,
                           local_278);
              btreeblk_end((btreeblk_handle *)pfVar5);
              for (local_5c = 0; (int)local_5c <= (int)local_54; local_5c = local_5c + 1) {
                sprintf(local_178,"%02d%06d",(ulong)local_58,(ulong)local_5c);
                sprintf((char *)local_278,"%02d%06x",(ulong)local_58,(ulong)local_5c);
                btree_find((btree *)(&local_1268[0].blk_alloc + (long)(int)local_58 * 7),local_178,
                           local_378);
                btreeblk_end((btreeblk_handle *)pfVar5);
                sVar2 = strlen((char *)local_278);
                iVar1 = memcmp(local_278,local_378,sVar2);
                if (iVar1 != 0) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                          ,0x1e8);
                  subblock_test::__test_pass = 0;
                  sVar2 = strlen((char *)local_278);
                  iVar1 = memcmp(local_278,local_378,sVar2);
                  if (iVar1 != 0) {
                    __assert_fail("!memcmp(valuebuf, temp, strlen(valuebuf))",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                  ,0x1e8,"void subblock_test()");
                  }
                }
              }
            }
            local_54 = local_54 + 1;
          } while( true );
        }
        sprintf(local_178,"%08d",(ulong)local_54);
        sprintf((char *)local_278,"%08x",(ulong)local_54);
        btree_insert(&local_468,local_178,local_278);
        btreeblk_end((btreeblk_handle *)pfVar5);
        filemgr_commit((filemgr *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0),
                       SUB81((ulong)pfVar5 >> 0x38,0),
                       (err_log_callback *)CONCAT44(in_stack_ffffffffffffebc4,uVar4));
        for (local_58 = 0; (int)local_58 <= (int)local_54; local_58 = local_58 + 1) {
          sprintf(local_178,"%08d",(ulong)local_58);
          sprintf((char *)local_278,"%08x",(ulong)local_58);
          btree_find(&local_468,local_178,local_378);
          btreeblk_end((btreeblk_handle *)pfVar5);
          sVar2 = strlen((char *)local_278);
          iVar1 = memcmp(local_278,local_378,sVar2);
          if (iVar1 != 0) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                    ,0x1cb);
            subblock_test::__test_pass = 0;
            sVar2 = strlen((char *)local_278);
            iVar1 = memcmp(local_278,local_378,sVar2);
            if (iVar1 != 0) {
              __assert_fail("!memcmp(valuebuf, temp, strlen(valuebuf))",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                            ,0x1cb,"void subblock_test()");
            }
          }
        }
        local_54 = local_54 + 1;
      } while( true );
    }
    sprintf(local_178,"%08d",(ulong)local_54);
    sprintf((char *)local_278,"%08x",(ulong)local_54);
    btree_insert(&local_468,local_178,local_278);
    btreeblk_end((btreeblk_handle *)pfVar5);
    for (local_58 = 0; (int)local_58 <= (int)local_54; local_58 = local_58 + 1) {
      sprintf(local_178,"%08d",(ulong)local_58);
      sprintf((char *)local_278,"%08x",(ulong)local_58);
      btree_find(&local_468,local_178,local_378);
      btreeblk_end((btreeblk_handle *)pfVar5);
      sVar2 = strlen((char *)local_278);
      iVar1 = memcmp(local_278,local_378,sVar2);
      if (iVar1 != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                ,0x1b1);
        subblock_test::__test_pass = 0;
        sVar2 = strlen((char *)local_278);
        iVar1 = memcmp(local_278,local_378,sVar2);
        if (iVar1 != 0) {
          __assert_fail("!memcmp(valuebuf, temp, strlen(valuebuf))",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                        ,0x1b1,"void subblock_test()");
        }
      }
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

void subblock_test()
{
    TEST_INIT();

    int i, j, k, r, nbtrees;
    int nodesize;
    int blocksize = 4096;
    char *fname = (char *) "./btreeblock_testfile";
    char keybuf[256], valuebuf[256], temp[256];
    filemgr_open_result result;
    btree_result br;
    bid_t bid;
    size_t subblock_no, idx;
    struct filemgr *file;
    struct btreeblk_handle bhandle;
    struct btree_kv_ops *ops;
    struct btree btree, btree_arr[64];
    struct filemgr_config fconfig;
    struct btree_meta meta;

    memset(&fconfig, 0, sizeof(fconfig));
    fconfig.blocksize = blocksize;
    fconfig.ncacheblock = 0;
    fconfig.options = FILEMGR_CREATE;
    fconfig.num_wal_shards = 8;
    ops = btree_kv_get_kb64_vb64(NULL);

    // btree initialization using large metadata test
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    meta.data = (void*)malloc(4096);

    meta.size = 120;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(is_subblock(btree.root_bid));
    subbid2bid(btree.root_bid, &subblock_no, &idx, &bid);
    TEST_CHK(subblock_no == 1);
    btreeblk_free(&bhandle);

    meta.size = 250;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(is_subblock(btree.root_bid));
    subbid2bid(btree.root_bid, &subblock_no, &idx, &bid);
    TEST_CHK(subblock_no == 2);
    btreeblk_free(&bhandle);

    meta.size = 510;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(is_subblock(btree.root_bid));
    subbid2bid(btree.root_bid, &subblock_no, &idx, &bid);
    TEST_CHK(subblock_no == 3);
    btreeblk_free(&bhandle);

    meta.size = 1020;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(is_subblock(btree.root_bid));
    subbid2bid(btree.root_bid, &subblock_no, &idx, &bid);
    TEST_CHK(subblock_no == 4);
    btreeblk_free(&bhandle);

    meta.size = 2040;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(!is_subblock(btree.root_bid));
    btreeblk_free(&bhandle);

    meta.size = 4090;
    btreeblk_init(&bhandle, file, blocksize);
    br = btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(br == BTREE_RESULT_FAIL);

    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();
    free(meta.data);

    // coverage: enlarge case 1-1
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    for (i=0;i<256;++i){
        sprintf(keybuf, "%08d", i);
        sprintf(valuebuf, "%08x", i);
        btree_insert(&btree, (void*)keybuf, (void*)valuebuf);
        btreeblk_end(&bhandle);
        for (j=0;j<=i;++j){
            sprintf(keybuf, "%08d", j);
            sprintf(valuebuf, "%08x", j);
            btree_find(&btree, (void*)keybuf, (void*)temp);
            btreeblk_end(&bhandle);
            TEST_CHK(!memcmp(valuebuf, temp, strlen(valuebuf)));
        }
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    // coverage: enlarge case 1-2, move case 1
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    for (i=0;i<256;++i){
        sprintf(keybuf, "%08d", i);
        sprintf(valuebuf, "%08x", i);
        btree_insert(&btree, (void*)keybuf, (void*)valuebuf);
        btreeblk_end(&bhandle);
        filemgr_commit(file, true, NULL);
        for (j=0;j<=i;++j){
            sprintf(keybuf, "%08d", j);
            sprintf(valuebuf, "%08x", j);
            btree_find(&btree, (void*)keybuf, (void*)temp);
            btreeblk_end(&bhandle);
            TEST_CHK(!memcmp(valuebuf, temp, strlen(valuebuf)));
        }
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    // coverage: enlarge case 1-1, 2-1, 2-2, 3-1
    nbtrees = 2;
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    for (i=0;i<nbtrees;++i){
        btree_init(&btree_arr[i], (void*)&bhandle, btreeblk_get_ops(), ops,
                   blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    }
    for (i=0;i<256;++i){
        for (j=0;j<nbtrees;++j){
            sprintf(keybuf, "%02d%06d", j, i);
            sprintf(valuebuf, "%02d%06x", j, i);
            btree_insert(&btree_arr[j], (void*)keybuf, (void*)valuebuf);
            btreeblk_end(&bhandle);
            for (k=0;k<=i;++k){
                sprintf(keybuf, "%02d%06d", j, k);
                sprintf(valuebuf, "%02d%06x", j, k);
                btree_find(&btree_arr[j], (void*)keybuf, (void*)temp);
                btreeblk_end(&bhandle);
                TEST_CHK(!memcmp(valuebuf, temp, strlen(valuebuf)));
            }
        }
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    // coverage: enlarge case 1-2, 2-1, 3-1, move case 1, 2-1, 2-2
    nbtrees = 2;
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    for (i=0;i<nbtrees;++i){
        btree_init(&btree_arr[i], (void*)&bhandle, btreeblk_get_ops(), ops,
                   blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    }
    for (i=0;i<256;++i){
        for (j=0;j<nbtrees;++j){
            sprintf(keybuf, "%02d%06d", j, i);
            sprintf(valuebuf, "%02d%06x", j, i);
            btree_insert(&btree_arr[j], (void*)keybuf, (void*)valuebuf);
            btreeblk_end(&bhandle);
        }
        filemgr_commit(file, true, NULL);
        for (j=0;j<nbtrees;++j){
            for (k=0;k<=i;++k){
                sprintf(keybuf, "%02d%06d", j, k);
                sprintf(valuebuf, "%02d%06x", j, k);
                btree_find(&btree_arr[j], (void*)keybuf, (void*)temp);
                btreeblk_end(&bhandle);
                TEST_CHK(!memcmp(valuebuf, temp, strlen(valuebuf)));
            }
        }
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    // coverage: enlarge case 1-1, 2-1, 3-2, move case 1, 2-1
    nbtrees = 7;
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    for (i=0;i<nbtrees;++i){
        btree_init(&btree_arr[i], (void*)&bhandle, btreeblk_get_ops(), ops,
                   blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    }
    for (j=0;j<nbtrees;++j){
        nodesize = 128 * (1<<j);
        for (i=0;i<(nodesize-16)/16;++i){
            sprintf(keybuf, "%02d%06d", j, i);
            sprintf(valuebuf, "%02d%06x", j, i);
            btree_insert(&btree_arr[j], (void*)keybuf, (void*)valuebuf);
            btreeblk_end(&bhandle);
        }
        filemgr_commit(file, true, NULL);
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    // coverage: enlarge case 1-1, 1-2, 2-1, 3-2, move case 1, 2-1
    nbtrees = 7;
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    for (i=0;i<nbtrees;++i){
        btree_init(&btree_arr[i], (void*)&bhandle, btreeblk_get_ops(), ops,
                   blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    }
    for (j=0;j<nbtrees;++j){
        nodesize = 128 * (1<<j);
        for (i=0;i<(nodesize-16)/16;++i){
            sprintf(keybuf, "%02d%06d", j, i);
            sprintf(valuebuf, "%02d%06x", j, i);
            btree_insert(&btree_arr[j], (void*)keybuf, (void*)valuebuf);
            btreeblk_end(&bhandle);
            filemgr_commit(file, true, NULL);
        }
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    free(ops);
    TEST_RESULT("subblock test");
}